

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::handleWritEvent(UdpSocket *this)

{
  _Elt_pointer puVar1;
  Buffer *this_00;
  Socket *this_01;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_02;
  char *pcVar2;
  void *__buf;
  ulong uVar3;
  off_t oVar4;
  value_type *first;
  socklen_t in_stack_ffffffffffffff68;
  shared_ptr<Liby::UdpSocket> self;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  
  std::__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&self.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>,
             &(this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
  local_50._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_invoke;
  local_78._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_manager;
  local_40 = 0;
  uStack_38 = 0;
  local_78._M_unused._M_object = this;
  local_50._M_unused._M_object = this;
  DeferCaller::~DeferCaller((DeferCaller *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  do {
    puVar1 = (this->writTasks_).
             super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) {
LAB_001140ba:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&self.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    this_00 = (puVar1->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = Buffer::data(this_00);
    __buf = (void *)Buffer::size(this_00);
    uVar3 = Socket::sendto(this_01,(int)pcVar2,__buf,0,(int)puVar1->dest_,(sockaddr *)0x10,
                           in_stack_ffffffffffffff68);
    if ((int)uVar3 < 0) {
      handleErroEvent(this);
      goto LAB_001140ba;
    }
    Buffer::retrieve(this_00,uVar3 & 0xffffffff);
    oVar4 = Buffer::size(this_00);
    if (oVar4 == 0) {
      this_02._M_head_impl =
           (puVar1->handler_)._M_t.
           super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
           .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
      if ((this_02._M_head_impl != (function<void_()> *)0x0) &&
         (*(_Manager_type *)((long)&(this_02._M_head_impl)->super__Function_base + 0x10) !=
          (_Manager_type)0x0)) {
        std::function<void_()>::operator()(this_02._M_head_impl);
      }
      std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::pop_front
                (&this->writTasks_);
    }
  } while( true );
}

Assistant:

void UdpSocket::handleWritEvent() {
    auto self = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });

    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        auto &buffer = *(first.buffer_);

        int n = socket_->sendto(buffer.data(), buffer.size(), 0,
                                (struct sockaddr *)first.dest_,
                                sizeof(struct sockaddr_in));

        if (n < 0) {
            if (n != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        buffer.retrieve(n);
        if (buffer.size() == 0) {
            if (first.handler_ && *(first.handler_))
                (*first.handler_)();
            writTasks_.pop_front();
        }
    }
}